

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_unittest.cc
# Opt level: O0

void Test_Template_AutoEscaping::Run(void)

{
  TemplateString TVar1;
  TemplateString TVar2;
  TemplateString TVar3;
  TemplateString TVar4;
  TemplateString TVar5;
  TemplateString TVar6;
  TemplateString TVar7;
  TemplateString TVar8;
  TemplateString TVar9;
  TemplateString TVar10;
  TemplateString TVar11;
  TemplateString TVar12;
  TemplateString TVar13;
  TemplateString TVar14;
  TemplateString TVar15;
  TemplateString TVar16;
  TemplateString TVar17;
  TemplateString TVar18;
  TemplateString TVar19;
  TemplateString TVar20;
  TemplateString TVar21;
  TemplateString TVar22;
  TemplateString TVar23;
  TemplateString TVar24;
  TemplateString TVar25;
  TemplateString TVar26;
  TemplateString TVar27;
  TemplateString TVar28;
  TemplateString TVar29;
  Template *pTVar30;
  allocator local_a01;
  string local_a00 [39];
  allocator local_9d9;
  string local_9d8 [32];
  TemplateString local_9b8;
  TemplateString local_998;
  ctemplate local_978 [32];
  TemplateString local_958;
  TemplateString local_938;
  TemplateString local_918;
  TemplateDictionary local_8f8 [8];
  TemplateDictionary dict3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_888 [32];
  string local_868 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_848 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_828 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_808 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_7a8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_788 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_768 [8];
  string expected_out;
  TemplateString local_748;
  TemplateString local_728;
  TemplateString local_708;
  ctemplate local_6e8 [32];
  TemplateString local_6c8;
  undefined8 local_6a8;
  TemplateDictionary *dict_inc4;
  size_t sStack_698;
  bool local_690;
  undefined7 uStack_68f;
  TemplateId TStack_688;
  TemplateString local_680;
  ctemplate local_660 [32];
  TemplateString local_640;
  TemplateString local_620;
  undefined8 local_600;
  TemplateDictionary *dict_inc3;
  size_t sStack_5f0;
  bool local_5e8;
  undefined7 uStack_5e7;
  TemplateId TStack_5e0;
  TemplateString local_5d8;
  TemplateString local_5b8;
  ctemplate local_598 [32];
  TemplateString local_578;
  undefined8 local_558;
  TemplateDictionary *dict_inc2;
  size_t sStack_548;
  bool local_540;
  undefined7 uStack_53f;
  TemplateId TStack_538;
  TemplateString local_530;
  ctemplate local_510 [32];
  TemplateString local_4f0;
  TemplateString local_4d0;
  undefined8 local_4b0;
  TemplateDictionary *dict_inc1;
  size_t sStack_4a0;
  bool local_498;
  undefined7 uStack_497;
  TemplateId TStack_490;
  TemplateString local_488;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_468 [8];
  string text_inc4;
  allocator local_441;
  string local_440 [8];
  string text_inc3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_420 [8];
  string text_inc2;
  allocator local_3f9;
  string local_3f8 [8];
  string text_inc1;
  TemplateString local_3d8;
  TemplateString local_3b8;
  TemplateString local_398;
  TemplateDictionary local_378 [8];
  TemplateDictionary dict2;
  TemplateString local_308;
  TemplateString local_2e8;
  ctemplate local_2c8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8 [32];
  TemplateString local_288;
  TemplateString local_268;
  ctemplate local_248 [32];
  TemplateString local_228;
  TemplateString local_208;
  undefined8 local_1e8;
  TemplateDictionary *inc_dict;
  TemplateDictionary local_1c0 [8];
  TemplateDictionary dict;
  allocator local_149;
  string local_148 [8];
  string inc_text;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128 [39];
  allocator local_101;
  string local_100 [8];
  string kAutoescapeHtmlPragma;
  allocator local_d9;
  string local_d8 [8];
  string expected_mods;
  allocator local_b1;
  string local_b0 [8];
  string user_esc;
  allocator local_79;
  string local_78 [8];
  string user;
  string local_58 [8];
  string text;
  string local_38 [8];
  string filename;
  Template *tpl;
  Strip strip;
  
  std::__cxx11::string::string(local_38);
  std::__cxx11::string::string(local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"John<>Doe",&local_79);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b0,"John&lt;&gt;Doe",&local_b1);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::operator=
            (local_58,
             "{{%AUTOESCAPE context=\"HTML\"}}{{USER:o}}<a href=\"{{URL}}\" class={{CLASS:h}}</a>");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x76b,"tpl = StringToTemplate(text, strip)");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 == (Template *)0x0) {
      __assert_fail("tpl = StringToTemplate(text, strip)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x76b,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d8,"USER:o:h\nURL:U=html\nCLASS:h:H=attribute\n",&local_d9);
  std::allocator<char>::~allocator((allocator<char> *)&local_d9);
  AssertCorrectModifiersInTemplate(pTVar30,(string *)local_58,(string *)local_d8);
  std::__cxx11::string::operator=
            (local_58,
             "{{%AUTOESCAPE context=\"HTML\" state=\"IN_TAG\"}}href=\"{{URL}}\" class={{CLASS:h}} style=\"font:{{COLOR}}\""
            );
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x771,"tpl = StringToTemplate(text, strip)");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 == (Template *)0x0) {
      __assert_fail("tpl = StringToTemplate(text, strip)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x771,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_d8,"URL:U=html\nCLASS:h:H=attribute\nCOLOR:c\n");
  AssertCorrectModifiersInTemplate(pTVar30,(string *)local_58,(string *)local_d8);
  std::__cxx11::string::operator=
            (local_58,
             "{{%AUTOESCAPE context=\"HTML\" state=\"in_tag\"}}href=\"{{URL}}\" class={{CLASS:h}} style=\"font:{{COLOR}}\""
            );
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x777,"tpl = StringToTemplate(text, strip)");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 == (Template *)0x0) {
      __assert_fail("tpl = StringToTemplate(text, strip)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x777,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_d8,"URL:U=html\nCLASS:h:H=attribute\nCOLOR:c\n");
  AssertCorrectModifiersInTemplate(pTVar30,(string *)local_58,(string *)local_d8);
  std::__cxx11::string::operator+=(local_58,">Hello</a><span>Some text</span></body></html>");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x77e,"tpl = StringToTemplate(text, strip)");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 == (Template *)0x0) {
      __assert_fail("tpl = StringToTemplate(text, strip)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x77e,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_d8,"URL:U=html\nCLASS:h:H=attribute\nCOLOR:c\n");
  AssertCorrectModifiersInTemplate(pTVar30,(string *)local_58,(string *)local_d8);
  std::__cxx11::string::operator=
            (local_58,"{{%AUTOESCAPE context=\"JAVASCRIPT\"}}var a = {{A}}; var b = \'{{B:h}}\';");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x784,"tpl = StringToTemplate(text, strip)");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 == (Template *)0x0) {
      __assert_fail("tpl = StringToTemplate(text, strip)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x784,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_d8,"A:J=number\nB:h:j\n");
  AssertCorrectModifiersInTemplate(pTVar30,(string *)local_58,(string *)local_d8);
  std::__cxx11::string::operator=
            (local_58,
             "{{%AUTOESCAPE context=\"CSS\"}}body {color:\"{{COLOR}}\"; font-size:{{SIZE:j}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x78a,"tpl = StringToTemplate(text, strip)");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 == (Template *)0x0) {
      __assert_fail("tpl = StringToTemplate(text, strip)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x78a,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_d8,"COLOR:c\nSIZE:j:c\n");
  AssertCorrectModifiersInTemplate(pTVar30,(string *)local_58,(string *)local_d8);
  std::__cxx11::string::operator=
            (local_58,"{{%AUTOESCAPE context=\"JSON\"}}{ \'id\': {{ID:j}}, \'value\': {{VALUE:h}} }"
            );
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x790,"tpl = StringToTemplate(text, strip)");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 == (Template *)0x0) {
      __assert_fail("tpl = StringToTemplate(text, strip)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x790,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_d8,"ID:j\nVALUE:h:j\n");
  AssertCorrectModifiersInTemplate(pTVar30,(string *)local_58,(string *)local_d8);
  std::__cxx11::string::operator=
            (local_58,"{{%AUTOESCAPE context=\"XML\"}}<PARAM name=\"{{VAL}}\">{{DATA:h}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x796,"tpl = StringToTemplate(text, strip)");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 == (Template *)0x0) {
      __assert_fail("tpl = StringToTemplate(text, strip)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x796,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_d8,"VAL:xml_escape\nDATA:h\n");
  AssertCorrectModifiersInTemplate(pTVar30,(string *)local_58,(string *)local_d8);
  std::__cxx11::string::operator=
            (local_58,"{{%AUTOESCAPE context=\"xml\"}}<PARAM name=\"{{VAL}}\">{{DATA:h}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x79c,"tpl = StringToTemplate(text, strip)");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 == (Template *)0x0) {
      __assert_fail("tpl = StringToTemplate(text, strip)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x79c,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_d8,"VAL:xml_escape\nDATA:h\n");
  AssertCorrectModifiersInTemplate(pTVar30,(string *)local_58,(string *)local_d8);
  std::__cxx11::string::operator=(local_58,"{{!bla}}{{%AUTOESCAPE context=\"HTML\"}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7a1,"tpl = StringToTemplate(text, strip)");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 == (Template *)0x0) {
      __assert_fail("tpl = StringToTemplate(text, strip)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7a1,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{%AUTOESCAPE context=\"HTML\" state=\"default\"}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 == (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7a3,"tpl = StringToTemplate(text, strip)");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 == (Template *)0x0) {
      __assert_fail("tpl = StringToTemplate(text, strip)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7a3,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{%AUTOESCAPE}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7a8,"(tpl = StringToTemplate(text, strip)) == NULL");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7a8,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{%AUTOESCAPER context=\"HTML\"}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7aa,"(tpl = StringToTemplate(text, strip)) == NULL");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7aa,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{%}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7ac,"(tpl = StringToTemplate(text, strip)) == NULL");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7ac,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{% }}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7ae,"(tpl = StringToTemplate(text, strip)) == NULL");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7ae,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{% =}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7b0,"(tpl = StringToTemplate(text, strip)) == NULL");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7b0,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{%AUTOESCAPE =\"HTML\"}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7b2,"(tpl = StringToTemplate(text, strip)) == NULL");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7b2,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{%AUTOESCAPE foo=\"HTML\"}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7b4,"(tpl = StringToTemplate(text, strip)) == NULL");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7b4,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{%AUTOESCAPE =}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7b6,"(tpl = StringToTemplate(text, strip)) == NULL");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7b6,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{%AUTOESCAPE context=HTML}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7b8,"(tpl = StringToTemplate(text, strip)) == NULL");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7b8,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{%AUTOESCAPE context=\"HTML}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7ba,"(tpl = StringToTemplate(text, strip)) == NULL");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7ba,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{%AUTOESCAPE context=\"\\\"HTML\"}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7bc,"(tpl = StringToTemplate(text, strip)) == NULL");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7bc,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{%AUTOESCAPE context=\"\\\"HT\\\"\\\"ML\\\"\"}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7be,"(tpl = StringToTemplate(text, strip)) == NULL");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7be,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{%AUTOESCAPE context=\"\"HTML\"}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7c0,"(tpl = StringToTemplate(text, strip)) == NULL");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7c0,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{%AUTOESCAPE context=\"JAVASCRIPT\" bla}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7c2,"(tpl = StringToTemplate(text, strip)) == NULL");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7c2,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{%AUTOESCAPE context=\"JAVASCRIPT\"bla}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7c4,"(tpl = StringToTemplate(text, strip)) == NULL");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7c4,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{%AUTOESCAPE context=\"JAVASCRIPT\" foo=bla}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7c6,"(tpl = StringToTemplate(text, strip)) == NULL");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7c6,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{%AUTOESCAPE  context=\"HTML\"}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7c8,"(tpl = StringToTemplate(text, strip)) == NULL");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7c8,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{%AUTOESCAPE context =\"HTML\"}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7ca,"(tpl = StringToTemplate(text, strip)) == NULL");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7ca,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{%AUTOESCAPE context= \"HTML\"}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7cc,"(tpl = StringToTemplate(text, strip)) == NULL");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7cc,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{%AUTOESCAPE context=\"HTML\" }}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 != (Template *)0x0) {
    printf("ASSERT FAILED, line %d: %s\n",0x7ce,"(tpl = StringToTemplate(text, strip)) == NULL");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7ce,"static void Test_Template_AutoEscaping::Run()");
    }
    exit(1);
  }
  std::__cxx11::string::operator=(local_58,"{{%AUTOESCAPE context=\"Xml\"}}");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 == (Template *)0x0) {
    std::__cxx11::string::operator=(local_58,"{{%AUTOESCAPE context=\"HTML\" state=\"tag\"}}");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      printf("ASSERT FAILED, line %d: %s\n",0x7d2,"(tpl = StringToTemplate(text, strip)) == NULL");
      pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
      if (pTVar30 != (Template *)0x0) {
        __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                      ,0x7d2,"static void Test_Template_AutoEscaping::Run()");
      }
      exit(1);
    }
    std::__cxx11::string::operator=(local_58,"{{%AUTOESCAPE context=\"CSS\" state=\"IN_TAG\"}}");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      printf("ASSERT FAILED, line %d: %s\n",0x7d4,"(tpl = StringToTemplate(text, strip)) == NULL");
      pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
      if (pTVar30 != (Template *)0x0) {
        __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                      ,0x7d4,"static void Test_Template_AutoEscaping::Run()");
      }
      exit(1);
    }
    std::__cxx11::string::operator=(local_58,"Hello{{%AUTOESCAPE context=\"HTML\"}}");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      printf("ASSERT FAILED, line %d: %s\n",0x7d6,"(tpl = StringToTemplate(text, strip)) == NULL");
      pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
      if (pTVar30 != (Template *)0x0) {
        __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                      ,0x7d6,"static void Test_Template_AutoEscaping::Run()");
      }
      exit(1);
    }
    std::__cxx11::string::operator=(local_58,"{{USER}}{{%AUTOESCAPE context=\"HTML\"}}");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      printf("ASSERT FAILED, line %d: %s\n",0x7d8,"(tpl = StringToTemplate(text, strip)) == NULL");
      pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
      if (pTVar30 != (Template *)0x0) {
        __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                      ,0x7d8,"static void Test_Template_AutoEscaping::Run()");
      }
      exit(1);
    }
    std::__cxx11::string::operator=(local_58,"{{#SEC}}{{%AUTOESCAPE context=\"HTML\"}}{{/SEC}}");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      printf("ASSERT FAILED, line %d: %s\n",0x7da,"(tpl = StringToTemplate(text, strip)) == NULL");
      pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
      if (pTVar30 != (Template *)0x0) {
        __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                      ,0x7da,"static void Test_Template_AutoEscaping::Run()");
      }
      exit(1);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_100,"{{%AUTOESCAPE context=\"HTML\"}}",&local_101);
    std::allocator<char>::~allocator((allocator<char> *)&local_101);
    std::operator+(local_128,(char *)local_100);
    std::__cxx11::string::operator=(local_58,(string *)local_128);
    std::__cxx11::string::~string((string *)local_128);
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 == (Template *)0x0) {
      printf("ASSERT FAILED, line %d: %s\n",0x7e4,"tpl");
      __assert_fail("tpl",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7e4,"static void Test_Template_AutoEscaping::Run()");
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"{{USER}}",&local_149);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    ctemplate::TemplateString::TemplateString((TemplateString *)&inc_dict,"dict");
    ctemplate::TemplateDictionary::TemplateDictionary
              (local_1c0,(TemplateString *)&inc_dict,(UnsafeArena *)0x0);
    ctemplate::TemplateString::TemplateString(&local_208,"INC");
    TVar1.length_ = local_208.length_;
    TVar1.ptr_ = local_208.ptr_;
    TVar1.is_immutable_ = local_208.is_immutable_;
    TVar1._17_7_ = local_208._17_7_;
    TVar1.id_ = local_208.id_;
    local_1e8 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar1);
    ctemplate::StringToTemplateFile(local_248,(string *)local_148);
    ctemplate::TemplateString::TemplateString(&local_228,(string *)local_248);
    TVar2.length_ = local_228.length_;
    TVar2.ptr_ = local_228.ptr_;
    TVar2.is_immutable_ = local_228.is_immutable_;
    TVar2._17_7_ = local_228._17_7_;
    TVar2.id_ = local_228.id_;
    ctemplate::TemplateDictionary::SetFilename(TVar2);
    std::__cxx11::string::~string((string *)local_248);
    ctemplate::TemplateString::TemplateString(&local_268,"USER");
    ctemplate::TemplateString::TemplateString(&local_288,(string *)local_78);
    TVar3.length_ = local_268.length_;
    TVar3.ptr_ = local_268.ptr_;
    TVar3.is_immutable_ = local_268.is_immutable_;
    TVar3._17_7_ = local_268._17_7_;
    TVar3.id_ = local_268.id_;
    TVar22.length_ = local_288.length_;
    TVar22.ptr_ = local_288.ptr_;
    TVar22.is_immutable_ = local_288.is_immutable_;
    TVar22._17_7_ = local_288._17_7_;
    TVar22.id_ = local_288.id_;
    ctemplate::TemplateDictionary::SetValue(TVar3,TVar22);
    ctemplate::AssertExpandIs(pTVar30,local_1c0,(string *)local_78,true);
    std::operator+(local_2a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
    std::__cxx11::string::operator=(local_148,(string *)local_2a8);
    std::__cxx11::string::~string((string *)local_2a8);
    ctemplate::StringToTemplateFile(local_2c8,(string *)local_148);
    std::__cxx11::string::operator=(local_38,(string *)local_2c8);
    std::__cxx11::string::~string((string *)local_2c8);
    ctemplate::TemplateString::TemplateString(&local_2e8,(string *)local_38);
    TVar4.length_ = local_2e8.length_;
    TVar4.ptr_ = local_2e8.ptr_;
    TVar4.is_immutable_ = local_2e8.is_immutable_;
    TVar4._17_7_ = local_2e8._17_7_;
    TVar4.id_ = local_2e8.id_;
    ctemplate::TemplateDictionary::SetFilename(TVar4);
    ctemplate::AssertExpandIs(pTVar30,local_1c0,(string *)local_b0,true);
    ctemplate::TemplateString::TemplateString(&local_308,(string *)local_148);
    pTVar30 = (Template *)ctemplate::Template::StringToTemplate(&local_308,STRIP_WHITESPACE);
    if (pTVar30 == (Template *)0x0) {
      printf("ASSERT FAILED, line %d: %s\n",0x7f4,"tpl");
      __assert_fail("tpl",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                    ,0x7f4,"static void Test_Template_AutoEscaping::Run()");
    }
    ctemplate::TemplateString::TemplateString(&local_398,"dict2");
    ctemplate::TemplateDictionary::TemplateDictionary(local_378,&local_398,(UnsafeArena *)0x0);
    ctemplate::TemplateString::TemplateString(&local_3b8,"USER");
    ctemplate::TemplateString::TemplateString(&local_3d8,(string *)local_78);
    TVar5.length_ = local_3b8.length_;
    TVar5.ptr_ = local_3b8.ptr_;
    TVar5.is_immutable_ = local_3b8.is_immutable_;
    TVar5._17_7_ = local_3b8._17_7_;
    TVar5.id_ = local_3b8.id_;
    TVar23.length_ = local_3d8.length_;
    TVar23.ptr_ = local_3d8.ptr_;
    TVar23.is_immutable_ = local_3d8.is_immutable_;
    TVar23._17_7_ = local_3d8._17_7_;
    TVar23.id_ = local_3d8.id_;
    ctemplate::TemplateDictionary::SetValue(TVar5,TVar23);
    ctemplate::AssertExpandIs(pTVar30,local_378,(string *)local_b0,true);
    if (pTVar30 != (Template *)0x0) {
      (**(code **)(*(long *)pTVar30 + 8))();
    }
    std::__cxx11::string::operator=(local_58,"Parent: {{USER}}; {{>INCONE}}");
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3f8,"INC1: {{USER1}}; {{>INCTWO}}",&local_3f9);
    std::allocator<char>::~allocator((allocator<char> *)&local_3f9);
    std::operator+(local_420,(char *)local_100);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_440,"INC3: {{USER3}}; {{>INCFOUR}}",&local_441);
    std::allocator<char>::~allocator((allocator<char> *)&local_441);
    std::operator+(local_468,(char *)local_100);
    ctemplate::TemplateString::TemplateString(&local_488,"USER");
    ctemplate::TemplateString::TemplateString((TemplateString *)&dict_inc1,(string *)local_78);
    TVar6.length_ = local_488.length_;
    TVar6.ptr_ = local_488.ptr_;
    TVar6.is_immutable_ = local_488.is_immutable_;
    TVar6._17_7_ = local_488._17_7_;
    TVar6.id_ = local_488.id_;
    TVar24.length_ = sStack_4a0;
    TVar24.ptr_ = (char *)dict_inc1;
    TVar24.is_immutable_ = local_498;
    TVar24._17_7_ = uStack_497;
    TVar24.id_ = TStack_490;
    ctemplate::TemplateDictionary::SetValue(TVar6,TVar24);
    ctemplate::TemplateString::TemplateString(&local_4d0,"INCONE");
    TVar7.length_ = local_4d0.length_;
    TVar7.ptr_ = local_4d0.ptr_;
    TVar7.is_immutable_ = local_4d0.is_immutable_;
    TVar7._17_7_ = local_4d0._17_7_;
    TVar7.id_ = local_4d0.id_;
    local_4b0 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar7);
    ctemplate::StringToTemplateFile(local_510,(string *)local_3f8);
    ctemplate::TemplateString::TemplateString(&local_4f0,(string *)local_510);
    TVar8.length_ = local_4f0.length_;
    TVar8.ptr_ = local_4f0.ptr_;
    TVar8.is_immutable_ = local_4f0.is_immutable_;
    TVar8._17_7_ = local_4f0._17_7_;
    TVar8.id_ = local_4f0.id_;
    ctemplate::TemplateDictionary::SetFilename(TVar8);
    std::__cxx11::string::~string((string *)local_510);
    ctemplate::TemplateString::TemplateString(&local_530,"USER1");
    ctemplate::TemplateString::TemplateString((TemplateString *)&dict_inc2,(string *)local_78);
    TVar9.length_ = local_530.length_;
    TVar9.ptr_ = local_530.ptr_;
    TVar9.is_immutable_ = local_530.is_immutable_;
    TVar9._17_7_ = local_530._17_7_;
    TVar9.id_ = local_530.id_;
    TVar25.length_ = sStack_548;
    TVar25.ptr_ = (char *)dict_inc2;
    TVar25.is_immutable_ = local_540;
    TVar25._17_7_ = uStack_53f;
    TVar25.id_ = TStack_538;
    ctemplate::TemplateDictionary::SetValue(TVar9,TVar25);
    ctemplate::TemplateString::TemplateString(&local_578,"INCTWO");
    TVar10.length_ = local_578.length_;
    TVar10.ptr_ = local_578.ptr_;
    TVar10.is_immutable_ = local_578.is_immutable_;
    TVar10._17_7_ = local_578._17_7_;
    TVar10.id_ = local_578.id_;
    local_558 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar10);
    ctemplate::StringToTemplateFile(local_598,local_420);
    std::__cxx11::string::operator=(local_38,(string *)local_598);
    std::__cxx11::string::~string((string *)local_598);
    ctemplate::TemplateString::TemplateString(&local_5b8,(string *)local_38);
    TVar11.length_ = local_5b8.length_;
    TVar11.ptr_ = local_5b8.ptr_;
    TVar11.is_immutable_ = local_5b8.is_immutable_;
    TVar11._17_7_ = local_5b8._17_7_;
    TVar11.id_ = local_5b8.id_;
    ctemplate::TemplateDictionary::SetFilename(TVar11);
    ctemplate::TemplateString::TemplateString(&local_5d8,"USER2");
    ctemplate::TemplateString::TemplateString((TemplateString *)&dict_inc3,(string *)local_78);
    TVar12.length_ = local_5d8.length_;
    TVar12.ptr_ = local_5d8.ptr_;
    TVar12.is_immutable_ = local_5d8.is_immutable_;
    TVar12._17_7_ = local_5d8._17_7_;
    TVar12.id_ = local_5d8.id_;
    TVar26.length_ = sStack_5f0;
    TVar26.ptr_ = (char *)dict_inc3;
    TVar26.is_immutable_ = local_5e8;
    TVar26._17_7_ = uStack_5e7;
    TVar26.id_ = TStack_5e0;
    ctemplate::TemplateDictionary::SetValue(TVar12,TVar26);
    ctemplate::TemplateString::TemplateString(&local_620,"INCTHREE");
    TVar13.length_ = local_620.length_;
    TVar13.ptr_ = local_620.ptr_;
    TVar13.is_immutable_ = local_620.is_immutable_;
    TVar13._17_7_ = local_620._17_7_;
    TVar13.id_ = local_620.id_;
    local_600 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar13);
    ctemplate::StringToTemplateFile(local_660,(string *)local_440);
    ctemplate::TemplateString::TemplateString(&local_640,(string *)local_660);
    TVar14.length_ = local_640.length_;
    TVar14.ptr_ = local_640.ptr_;
    TVar14.is_immutable_ = local_640.is_immutable_;
    TVar14._17_7_ = local_640._17_7_;
    TVar14.id_ = local_640.id_;
    ctemplate::TemplateDictionary::SetFilename(TVar14);
    std::__cxx11::string::~string((string *)local_660);
    ctemplate::TemplateString::TemplateString(&local_680,"USER3");
    ctemplate::TemplateString::TemplateString((TemplateString *)&dict_inc4,(string *)local_78);
    TVar15.length_ = local_680.length_;
    TVar15.ptr_ = local_680.ptr_;
    TVar15.is_immutable_ = local_680.is_immutable_;
    TVar15._17_7_ = local_680._17_7_;
    TVar15.id_ = local_680.id_;
    TVar27.length_ = sStack_698;
    TVar27.ptr_ = (char *)dict_inc4;
    TVar27.is_immutable_ = local_690;
    TVar27._17_7_ = uStack_68f;
    TVar27.id_ = TStack_688;
    ctemplate::TemplateDictionary::SetValue(TVar15,TVar27);
    ctemplate::TemplateString::TemplateString(&local_6c8,"INCFOUR");
    TVar16.length_ = local_6c8.length_;
    TVar16.ptr_ = local_6c8.ptr_;
    TVar16.is_immutable_ = local_6c8.is_immutable_;
    TVar16._17_7_ = local_6c8._17_7_;
    TVar16.id_ = local_6c8.id_;
    local_6a8 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar16);
    ctemplate::StringToTemplateFile(local_6e8,local_468);
    std::__cxx11::string::operator=(local_38,(string *)local_6e8);
    std::__cxx11::string::~string((string *)local_6e8);
    ctemplate::TemplateString::TemplateString(&local_708,(string *)local_38);
    TVar17.length_ = local_708.length_;
    TVar17.ptr_ = local_708.ptr_;
    TVar17.is_immutable_ = local_708.is_immutable_;
    TVar17._17_7_ = local_708._17_7_;
    TVar17.id_ = local_708.id_;
    ctemplate::TemplateDictionary::SetFilename(TVar17);
    ctemplate::TemplateString::TemplateString(&local_728,"USER4");
    ctemplate::TemplateString::TemplateString(&local_748,(string *)local_78);
    TVar18.length_ = local_728.length_;
    TVar18.ptr_ = local_728.ptr_;
    TVar18.is_immutable_ = local_728.is_immutable_;
    TVar18._17_7_ = local_728._17_7_;
    TVar18.id_ = local_728.id_;
    TVar28.length_ = local_748.length_;
    TVar28.ptr_ = local_748.ptr_;
    TVar28.is_immutable_ = local_748.is_immutable_;
    TVar28._17_7_ = local_748._17_7_;
    TVar28.id_ = local_748.id_;
    ctemplate::TemplateDictionary::SetValue(TVar18,TVar28);
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    std::operator+((char *)local_868,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"Parent: ");
    std::operator+(local_848,(char *)local_868);
    std::operator+(local_828,local_848);
    std::operator+(local_808,(char *)local_828);
    std::operator+(local_7e8,local_808);
    std::operator+(local_7c8,(char *)local_7e8);
    std::operator+(local_7a8,local_7c8);
    std::operator+(local_788,(char *)local_7a8);
    std::operator+(local_768,local_788);
    std::__cxx11::string::~string((string *)local_788);
    std::__cxx11::string::~string((string *)local_7a8);
    std::__cxx11::string::~string((string *)local_7c8);
    std::__cxx11::string::~string((string *)local_7e8);
    std::__cxx11::string::~string((string *)local_808);
    std::__cxx11::string::~string((string *)local_828);
    std::__cxx11::string::~string((string *)local_848);
    std::__cxx11::string::~string(local_868);
    ctemplate::AssertExpandIs(pTVar30,local_1c0,local_768,true);
    std::operator+(local_888,(char *)local_100);
    std::__cxx11::string::operator=(local_58,(string *)local_888);
    std::__cxx11::string::~string((string *)local_888);
    std::__cxx11::string::operator=(local_148,"{{USER}}");
    pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
    if (pTVar30 != (Template *)0x0) {
      ctemplate::TemplateString::TemplateString(&local_918,"dict");
      ctemplate::TemplateDictionary::TemplateDictionary(local_8f8,&local_918,(UnsafeArena *)0x0);
      ctemplate::TemplateString::TemplateString(&local_938,"INC");
      TVar19.length_ = local_938.length_;
      TVar19.ptr_ = local_938.ptr_;
      TVar19.is_immutable_ = local_938.is_immutable_;
      TVar19._17_7_ = local_938._17_7_;
      TVar19.id_ = local_938.id_;
      local_1e8 = ctemplate::TemplateDictionary::AddIncludeDictionary(TVar19);
      ctemplate::StringToTemplateFile(local_978,(string *)local_148);
      ctemplate::TemplateString::TemplateString(&local_958,(string *)local_978);
      TVar20.length_ = local_958.length_;
      TVar20.ptr_ = local_958.ptr_;
      TVar20.is_immutable_ = local_958.is_immutable_;
      TVar20._17_7_ = local_958._17_7_;
      TVar20.id_ = local_958.id_;
      ctemplate::TemplateDictionary::SetFilename(TVar20);
      std::__cxx11::string::~string((string *)local_978);
      ctemplate::TemplateString::TemplateString(&local_998,"USER");
      ctemplate::TemplateString::TemplateString(&local_9b8,(string *)local_78);
      TVar21.length_ = local_998.length_;
      TVar21.ptr_ = local_998.ptr_;
      TVar21.is_immutable_ = local_998.is_immutable_;
      TVar21._17_7_ = local_998._17_7_;
      TVar21.id_ = local_998.id_;
      TVar29.length_ = local_9b8.length_;
      TVar29.ptr_ = local_9b8.ptr_;
      TVar29.is_immutable_ = local_9b8.is_immutable_;
      TVar29._17_7_ = local_9b8._17_7_;
      TVar29.id_ = local_9b8.id_;
      ctemplate::TemplateDictionary::SetValue(TVar21,TVar29);
      ctemplate::AssertExpandIs(pTVar30,local_8f8,(string *)local_b0,true);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_9d8,"{{%AUTOESCAPE context=\"HTML\"}}\nText\n Text",&local_9d9);
      pTVar30 = ctemplate::StringToTemplate((string *)local_9d8,STRIP_BLANK_LINES);
      std::__cxx11::string::~string(local_9d8);
      std::allocator<char>::~allocator((allocator<char> *)&local_9d9);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a00,"Text\n Text",&local_a01);
      ctemplate::AssertExpandIs(pTVar30,local_1c0,(string *)local_a00,true);
      std::__cxx11::string::~string(local_a00);
      std::allocator<char>::~allocator((allocator<char> *)&local_a01);
      ctemplate::TemplateDictionary::~TemplateDictionary(local_8f8);
      std::__cxx11::string::~string((string *)local_768);
      std::__cxx11::string::~string((string *)local_468);
      std::__cxx11::string::~string(local_440);
      std::__cxx11::string::~string((string *)local_420);
      std::__cxx11::string::~string(local_3f8);
      ctemplate::TemplateDictionary::~TemplateDictionary(local_378);
      ctemplate::TemplateDictionary::~TemplateDictionary(local_1c0);
      std::__cxx11::string::~string(local_148);
      std::__cxx11::string::~string(local_100);
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string(local_b0);
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string(local_38);
      return;
    }
    printf("ASSERT FAILED, line %d: %s\n",0x821,"tpl");
    __assert_fail("tpl",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,0x821,"static void Test_Template_AutoEscaping::Run()");
  }
  printf("ASSERT FAILED, line %d: %s\n",2000,"(tpl = StringToTemplate(text, strip)) == NULL");
  pTVar30 = ctemplate::StringToTemplate((string *)local_58,STRIP_WHITESPACE);
  if (pTVar30 != (Template *)0x0) {
    __assert_fail("(tpl = StringToTemplate(text, strip)) == __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/tests/template_unittest.cc"
                  ,2000,"static void Test_Template_AutoEscaping::Run()");
  }
  exit(1);
}

Assistant:

TEST(Template, AutoEscaping) {
  Strip strip = STRIP_WHITESPACE;
  Template *tpl;
  string filename;
  string text;
  string user = "John<>Doe";
  string user_esc = "John&lt;&gt;Doe";

  // Positive test cases -- template initialization succeeds.
  // We also check that modifiers that were missing or given incorrect
  // have been updated as expected.
  // TODO(jad): Cut-down redundancy by merging with
  //            TestCorrectModifiersForAutoEscape.
  text = "{{%AUTOESCAPE context=\"HTML\"}}"         // HTML
      "{{USER:o}}<a href=\"{{URL}}\" class={{CLASS:h}}</a>";
  ASSERT(tpl = StringToTemplate(text, strip));
  string expected_mods = "USER:o:h\nURL:U=html\nCLASS:h:H=attribute\n";
  AssertCorrectModifiersInTemplate(tpl, text, expected_mods);

  text = "{{%AUTOESCAPE context=\"HTML\" state=\"IN_TAG\"}}"  // HTML in tag
      "href=\"{{URL}}\" class={{CLASS:h}} style=\"font:{{COLOR}}\"";
  ASSERT(tpl = StringToTemplate(text, strip));
  expected_mods = "URL:U=html\nCLASS:h:H=attribute\nCOLOR:c\n";
  AssertCorrectModifiersInTemplate(tpl, text, expected_mods);

  text = "{{%AUTOESCAPE context=\"HTML\" state=\"in_tag\"}}"  // lowercase ok
      "href=\"{{URL}}\" class={{CLASS:h}} style=\"font:{{COLOR}}\"";
  ASSERT(tpl = StringToTemplate(text, strip));
  expected_mods = "URL:U=html\nCLASS:h:H=attribute\nCOLOR:c\n";
  AssertCorrectModifiersInTemplate(tpl, text, expected_mods);

  // Repeat the test with trailing HTML that closes the tag. This is
  // undefined behavior. We test it to ensure the parser does not choke.
  text += ">Hello</a><span>Some text</span></body></html>";
  ASSERT(tpl = StringToTemplate(text, strip));
  expected_mods = "URL:U=html\nCLASS:h:H=attribute\nCOLOR:c\n";
  AssertCorrectModifiersInTemplate(tpl, text, expected_mods);

  text = "{{%AUTOESCAPE context=\"JAVASCRIPT\"}}"   // JAVASCRIPT
      "var a = {{A}}; var b = '{{B:h}}';";
  ASSERT(tpl = StringToTemplate(text, strip));
  expected_mods = "A:J=number\nB:h:j\n";
  AssertCorrectModifiersInTemplate(tpl, text, expected_mods);

  text = "{{%AUTOESCAPE context=\"CSS\"}}"          // CSS
      "body {color:\"{{COLOR}}\"; font-size:{{SIZE:j}}";
  ASSERT(tpl = StringToTemplate(text, strip));
  expected_mods = "COLOR:c\nSIZE:j:c\n";
  AssertCorrectModifiersInTemplate(tpl, text, expected_mods);

  text = "{{%AUTOESCAPE context=\"JSON\"}}"         // JSON
      "{ 'id': {{ID:j}}, 'value': {{VALUE:h}} }";
  ASSERT(tpl = StringToTemplate(text, strip));
  expected_mods = "ID:j\nVALUE:h:j\n";
  AssertCorrectModifiersInTemplate(tpl, text, expected_mods);

  text = "{{%AUTOESCAPE context=\"XML\"}}"          // XML
      "<PARAM name=\"{{VAL}}\">{{DATA:h}}";
  ASSERT(tpl = StringToTemplate(text, strip));
  expected_mods = "VAL:xml_escape\nDATA:h\n";
  AssertCorrectModifiersInTemplate(tpl, text, expected_mods);

  text = "{{%AUTOESCAPE context=\"xml\"}}"          // lower-case XML
      "<PARAM name=\"{{VAL}}\">{{DATA:h}}";
  ASSERT(tpl = StringToTemplate(text, strip));
  expected_mods = "VAL:xml_escape\nDATA:h\n";
  AssertCorrectModifiersInTemplate(tpl, text, expected_mods);

  text = "{{!bla}}{{%AUTOESCAPE context=\"HTML\"}}";  // after comment
  ASSERT(tpl = StringToTemplate(text, strip));
  text = "{{%AUTOESCAPE context=\"HTML\" state=\"default\"}}";
  ASSERT(tpl = StringToTemplate(text, strip));        // adding state

  // Negative test cases - template initialization fails due to errors
  // in the marker. Also checks that our parsing is defensive.
  text = "{{%AUTOESCAPE}}";                                 // missing context
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{%AUTOESCAPER context=\"HTML\"}}";               // invalid id
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{%}}";                                           // missing id
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{% }}";                                          // missing id
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{% =}}";                                         // missing id
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{%AUTOESCAPE =\"HTML\"}}";                       // missing name
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{%AUTOESCAPE foo=\"HTML\"}}";                    // bogus name
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{%AUTOESCAPE =}}";                               // lone '='
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{%AUTOESCAPE context=HTML}}";                    // val not quoted
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{%AUTOESCAPE context=\"HTML}}";                  // no end quotes
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{%AUTOESCAPE context=\"\\\"HTML\"}}";            // Unescape val
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{%AUTOESCAPE context=\"\\\"HT\\\"\\\"ML\\\"\"}}";   // more complex
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{%AUTOESCAPE context=\"\"HTML\"}}";              // Unescape val
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{%AUTOESCAPE context=\"JAVASCRIPT\" bla}}";      // extra attr
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{%AUTOESCAPE context=\"JAVASCRIPT\"bla}}";       // invalid value
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{%AUTOESCAPE context=\"JAVASCRIPT\" foo=bla}}";  // extra attr/val
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{%AUTOESCAPE  context=\"HTML\"}}";               // extra whitesp
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{%AUTOESCAPE context =\"HTML\"}}";               // extra whitesp
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{%AUTOESCAPE context= \"HTML\"}}";               // extra whitesp
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{%AUTOESCAPE context=\"HTML\" }}";               // extra whitesp
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{%AUTOESCAPE context=\"Xml\"}}";                 // mixed-case xml
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{%AUTOESCAPE context=\"HTML\" state=\"tag\"}}";  // bad state
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{%AUTOESCAPE context=\"CSS\" state=\"IN_TAG\"}}";  // invalid state
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "Hello{{%AUTOESCAPE context=\"HTML\"}}";           // after text
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{USER}}{{%AUTOESCAPE context=\"HTML\"}}";        // after variable
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);
  text = "{{#SEC}}{{%AUTOESCAPE context=\"HTML\"}}{{/SEC}}";  // not in MAIN
  ASSERT((tpl = StringToTemplate(text, strip)) == NULL);

  string kAutoescapeHtmlPragma = "{{%AUTOESCAPE context=\"HTML\"}}";

  // Check that Selective Auto-Escape does not auto-escape included templates
  // unless these are also marked for auto-escape. To attest that,
  // we check that when no escaping was given in the included template, none
  // will be applied to it. USER will not get html-escaped.
  text = kAutoescapeHtmlPragma + "{{>INC}}";
  tpl = StringToTemplate(text, strip);
  ASSERT(tpl);
  string inc_text = "{{USER}}";    // missing :h escaping.
  TemplateDictionary dict("dict");
  TemplateDictionary *inc_dict = dict.AddIncludeDictionary("INC");
  inc_dict->SetFilename(StringToTemplateFile(inc_text));
  inc_dict->SetValue("USER", user);
  AssertExpandIs(tpl, &dict, user, true);

  // Add AUTOESCAPE pragma to included template and check that it works.
  inc_text = kAutoescapeHtmlPragma + inc_text;
  filename = StringToTemplateFile(inc_text);
  inc_dict->SetFilename(filename);
  AssertExpandIs(tpl, &dict, user_esc, true);

  // Check that Selective Auto-Escape works with Template::StringToTemplate.
  tpl = Template::StringToTemplate(inc_text, strip);
  ASSERT(tpl);
  TemplateDictionary dict2("dict2");
  dict2.SetValue("USER", user);
  AssertExpandIs(tpl, &dict2, user_esc, true);
  delete tpl;

  // Test that Selective AutoEscape follows included templates: Included
  // templates 2 and 4 are registered for auto-escaping but not included
  // templates 1 and 3. Check that only templates 2 and 4 get escaped.
  text = "Parent: {{USER}}; {{>INCONE}}";
  string text_inc1 = "INC1: {{USER1}}; {{>INCTWO}}";
  string text_inc2 = kAutoescapeHtmlPragma + "INC2: {{USER2}}; {{>INCTHREE}}";
  string text_inc3 = "INC3: {{USER3}}; {{>INCFOUR}}";
  string text_inc4 = kAutoescapeHtmlPragma + "INC4: {{USER4}}";
  dict.SetValue("USER", user);

  TemplateDictionary *dict_inc1 = dict.AddIncludeDictionary("INCONE");
  dict_inc1->SetFilename(StringToTemplateFile(text_inc1));
  dict_inc1->SetValue("USER1", user);

  TemplateDictionary *dict_inc2 = dict_inc1->AddIncludeDictionary("INCTWO");
  filename = StringToTemplateFile(text_inc2);
  dict_inc2->SetFilename(filename);
  dict_inc2->SetValue("USER2", user);

  TemplateDictionary *dict_inc3 = dict_inc2->AddIncludeDictionary("INCTHREE");
  dict_inc3->SetFilename(StringToTemplateFile(text_inc3));
  dict_inc3->SetValue("USER3", user);

  TemplateDictionary *dict_inc4 = dict_inc3->AddIncludeDictionary("INCFOUR");
  filename = StringToTemplateFile(text_inc4);
  dict_inc4->SetFilename(filename);
  dict_inc4->SetValue("USER4", user);

  tpl = StringToTemplate(text, strip);
  string expected_out = "Parent: " + user + "; INC1: " + user +
      "; INC2: " + user_esc + "; INC3: " + user + "; INC4: " + user_esc;
  AssertExpandIs(tpl, &dict, expected_out, true);

  // Check that we do not modify template-includes.
  // Here, xml_escape would have been changed to :h:xml_escape
  // causing a double-escaping of the USER.
  text = kAutoescapeHtmlPragma + "{{>INC:xml_escape}}";
  inc_text = "{{USER}}";
  tpl = StringToTemplate(text, strip);
  ASSERT(tpl);
  TemplateDictionary dict3("dict");
  inc_dict = dict3.AddIncludeDictionary("INC");
  inc_dict->SetFilename(StringToTemplateFile(inc_text));
  inc_dict->SetValue("USER", user);
  AssertExpandIs(tpl, &dict3, user_esc, true);

  // Test that {{%...}} is a "removable" marker. A related test is
  // also added to TestStrip().
  tpl = StringToTemplate("{{%AUTOESCAPE context=\"HTML\"}}\nText\n Text",
                         STRIP_BLANK_LINES);
  AssertExpandIs(tpl, &dict, "Text\n Text", true);
}